

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

bool __thiscall soul::heart::IODeclaration::canHandleType(IODeclaration *this,Type *t)

{
  CastType CVar1;
  pointer pTVar2;
  bool bVar3;
  Type local_70;
  pointer local_58;
  Type *local_50;
  Type local_48;
  
  pTVar2 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
  bVar3 = pTVar2 != local_58;
  if (bVar3) {
    local_50 = t;
    do {
      local_70.category = pTVar2->category;
      local_70.arrayElementCategory = pTVar2->arrayElementCategory;
      local_70.isRef = pTVar2->isRef;
      local_70.isConstant = pTVar2->isConstant;
      local_70.primitiveType.type = (pTVar2->primitiveType).type;
      local_70.boundingSize = pTVar2->boundingSize;
      local_70.arrayElementBoundingSize = pTVar2->arrayElementBoundingSize;
      local_70.structure.object = (pTVar2->structure).object;
      if (local_70.structure.object != (Structure *)0x0) {
        ((local_70.structure.object)->super_RefCountedObject).refCount =
             ((local_70.structure.object)->super_RefCountedObject).refCount + 1;
      }
      getSampleArrayType(&local_48,this,&local_70);
      CVar1 = TypeRules::getCastType(&local_48,local_50);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_70.structure.object);
      if ((CVar1 < wrapValue & (byte)(0x1d6 >> ((byte)CVar1 & 0x1f))) != 0) {
        return bVar3;
      }
      pTVar2 = pTVar2 + 1;
      bVar3 = pTVar2 != local_58;
    } while (bVar3);
  }
  return bVar3;
}

Assistant:

bool canHandleType (const Type& t) const
        {
            for (auto& type : dataTypes)
                if (TypeRules::canSilentlyCastTo (getSampleArrayType (type), t))
                    return true;

            return false;
        }